

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzP.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzP::ArchiveIN(ChNodeFEAxyzP *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChNodeFEAxyzP *)
            ((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
            (long)(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-0x18]),in_RSI);
  return;
}

Assistant:

void ChNodeFEAxyzP::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAxyzP>();
    // deserialize parent class
    ChNodeFEAbase::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(P);
    marchive >> CHNVP(P_dt);
    marchive >> CHNVP(F);
}